

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O1

void __thiscall QLinuxFbDevice::swapBuffers(QLinuxFbDevice *this,Output *output)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  drmEventContext drmEvent;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = output->backFb;
  iVar1 = QKmsDevice::fd(&this->super_QKmsDevice);
  iVar2 = drmModePageFlip(iVar1,(output->kmsOutput).crtc_id,output->fb[iVar2].fb,1,output);
  if (iVar2 == -1) {
    swapBuffers();
  }
  else {
    iVar2 = output->backFb;
    do {
      uStack_50 = 0;
      local_48 = 0;
      local_68 = 2;
      uStack_60 = 0;
      local_58 = pageFlipHandler;
      iVar1 = QKmsDevice::fd(&this->super_QKmsDevice);
      drmHandleEvent(iVar1,&local_68);
    } while (output->backFb == iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLinuxFbDevice::swapBuffers(Output *output)
{
    Framebuffer &fb(output->fb[output->backFb]);
    if (drmModePageFlip(fd(), output->kmsOutput.crtc_id, fb.fb, DRM_MODE_PAGE_FLIP_EVENT, output) == -1) {
        qErrnoWarning(errno, "Page flip failed");
        return;
    }

    const int fbIdx = output->backFb;
    while (output->backFb == fbIdx) {
        drmEventContext drmEvent;
        memset(&drmEvent, 0, sizeof(drmEvent));
        drmEvent.version = 2;
        drmEvent.vblank_handler = nullptr;
        drmEvent.page_flip_handler = pageFlipHandler;
        // Blocks until there is something to read on the drm fd
        // and calls back pageFlipHandler once the flip completes.
        drmHandleEvent(fd(), &drmEvent);
    }
}